

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVInt.cpp
# Opt level: O2

bool slang::exactlyEqual(SVInt *lhs,SVInt *rhs)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  logic_t lVar4;
  bool bVar5;
  int iVar6;
  SVInt SStack_28;
  
  bVar5 = (lhs->super_SVIntStorage).unknownFlag;
  bVar1 = (rhs->super_SVIntStorage).unknownFlag;
  if (bVar5 == false) {
    if (bVar1 == false) {
      lVar4 = SVInt::operator==(lhs,rhs);
      return (lVar4.value & 0x7f) != 0 && lVar4.value != '@';
    }
  }
  else if (bVar1 != false) {
    uVar2 = (lhs->super_SVIntStorage).bitWidth;
    uVar3 = (rhs->super_SVIntStorage).bitWidth;
    if (uVar2 == uVar3) {
      iVar6 = bcmp((lhs->super_SVIntStorage).field_0.pVal,(rhs->super_SVIntStorage).field_0.pVal,
                   (ulong)(((uVar2 + 0x3f >> 6) << (bVar5 & 0x1fU)) << 3));
      return iVar6 == 0;
    }
    if (uVar2 < uVar3) {
      SVInt::extend(&SStack_28,(bitwidth_t)lhs,SUB41(uVar3,0));
      bVar5 = exactlyEqual(&SStack_28,rhs);
    }
    else {
      SVInt::extend(&SStack_28,(bitwidth_t)rhs,SUB41(uVar2,0));
      bVar5 = exactlyEqual(lhs,&SStack_28);
    }
    SVInt::~SVInt(&SStack_28);
    return bVar5;
  }
  return false;
}

Assistant:

bool exactlyEqual(const SVInt& lhs, const SVInt& rhs) {
    // if no unknown flags, do normal comparison
    if (!lhs.unknownFlag && !rhs.unknownFlag)
        return (bool)(lhs == rhs);

    // if one has unknown and the other doesn't, they're not equal
    if (!lhs.unknownFlag || !rhs.unknownFlag)
        return false;

    // handle sign extension if necessary
    if (lhs.bitWidth != rhs.bitWidth) {
        bool bothSigned = lhs.signFlag && rhs.signFlag;
        if (lhs.bitWidth < rhs.bitWidth)
            return exactlyEqual(lhs.extend(rhs.bitWidth, bothSigned), rhs);
        else
            return exactlyEqual(lhs, rhs.extend(lhs.bitWidth, bothSigned));
    }

    // ok, equal widths, and they both have unknown values, do a straight memory compare
    return memcmp(lhs.pVal, rhs.pVal, lhs.getNumWords() * SVInt::WORD_SIZE) == 0;
}